

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerSettings.cpp
# Opt level: O1

void __thiscall SWDAnalyzerSettings::LoadSettings(SWDAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  SimpleArchive local_20 [8];
  
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mSWDIO);
  SimpleArchive::operator>>(local_20,&this->mSWCLK);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWDIO,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWCLK,true);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSWDIOInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSWCLKInterface);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SWDAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSWDIO;
    text_archive >> mSWCLK;

    ClearChannels();

    AddChannel( mSWDIO, "SWDIO", true );
    AddChannel( mSWCLK, "SWCLK", true );

    UpdateInterfacesFromSettings();
}